

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

void RenderLoop(void)

{
  size_type *psVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  size_type *psVar3;
  double dVar4;
  Camera *pCVar5;
  PFNGLUNIFORM1IPROC p_Var6;
  PFNGLUNIFORM3FVPROC p_Var7;
  PFNGLUNIFORMMATRIX4FVPROC p_Var8;
  long lVar9;
  GLenum GVar10;
  GLint GVar11;
  ostream *poVar12;
  int iVar13;
  uint uVar14;
  float fVar15;
  GLuint headPtrTex;
  string local_3c8;
  col_type local_3a8;
  col_type local_398;
  float local_384;
  GLuint multisampledFBO;
  GLuint buffers [2];
  GLuint multisampleTex;
  Shader postProcessingShader;
  GLuint multisampleDepth;
  Shader transparentShader;
  GLuint zero;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2c8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> headPtrClear;
  Shader opaqueShader;
  mat<4,_4,_float,_(glm::qualifier)0> Result;
  mat4 view;
  mat4 pre_view;
  Model glTF_model;
  
  (*glad_glGenFramebuffers)(1,&multisampledFBO);
  (*glad_glBindFramebuffer)(0x8d40,multisampledFBO);
  (*glad_glGenTextures)(1,&multisampleTex);
  (*glad_glBindTexture)(0x9100,multisampleTex);
  (*glad_glTexImage2DMultisample)
            (0x9100,4,0x8814,WindowConfig::SCR_WIDTH,WindowConfig::SCR_HEIGHT,'\x01');
  (*glad_glBindTexture)(0x9100,0);
  (*glad_glFramebufferTexture2D)(0x8d40,0x8ce0,0x9100,multisampleTex,0);
  (*glad_glGenRenderbuffers)(1,&multisampleDepth);
  (*glad_glBindRenderbuffer)(0x8d41,multisampleDepth);
  (*glad_glRenderbufferStorageMultisample)
            (0x8d41,4,0x88f0,WindowConfig::SCR_WIDTH,WindowConfig::SCR_HEIGHT);
  (*glad_glFramebufferRenderbuffer)(0x8d40,0x8d00,0x8d41,multisampleDepth);
  GVar10 = (*glad_glCheckFramebufferStatus)(0x8d40);
  if (GVar10 != 0x8cd5) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Framebuffer not complete!",0x19);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x48);
    std::ostream::put(-0x48);
    std::ostream::flush();
  }
  (*glad_glBindFramebuffer)(0x8d40,0);
  iVar13 = WindowConfig::SCR_WIDTH * WindowConfig::SCR_HEIGHT;
  (*glad_glGenBuffers)(2,buffers);
  (*glad_glBindBuffer)(0x92c0,buffers[0]);
  (*glad_glBufferData)(0x92c0,4,(void *)0x0,0x88e8);
  (*glad_glBindBuffer)(0x90d2,buffers[1]);
  (*glad_glBufferData)(0x90d2,(ulong)(uint)(iVar13 * 0x180),(void *)0x0,0x88e8);
  (*glad_glGenTextures)(1,&headPtrTex);
  (*glad_glBindTexture)(0xde1,headPtrTex);
  (*glad_glTexStorage2D)(0xde1,1,0x8236,WindowConfig::SCR_WIDTH,WindowConfig::SCR_HEIGHT);
  glTF_model.transparent_queue.c.
  super__Vector_base<std::pair<float,_Model::RenderDependence>,_std::allocator<std::pair<float,_Model::RenderDependence>_>_>
  ._M_impl.super__Vector_impl_data._M_start._0_4_ = 0xffffffff;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&headPtrClear,(long)WindowConfig::SCR_HEIGHT * (long)WindowConfig::SCR_WIDTH,
             (value_type_conflict3 *)&glTF_model,(allocator_type *)&opaqueShader);
  local_384 = (float)WindowConfig::SCR_WIDTH / (float)WindowConfig::SCR_HEIGHT;
  fVar15 = local_384 + -1.1920929e-07;
  uVar14 = -(uint)(-fVar15 <= fVar15);
  if ((float)(~uVar14 & (uint)-fVar15 | (uint)fVar15 & uVar14) <= 0.0) {
    __assert_fail("abs(aspect - std::numeric_limits<T>::epsilon()) > static_cast<T>(0)",
                  "/workspace/llm4binary/github/license_c_cmakelists/zhanghao00925[P]glTF_viewer/libs/glm/glm/../glm/gtc/../ext/matrix_clip_space.inl"
                  ,0xfb,"mat<4, 4, T, defaultp> glm::perspectiveRH_NO(T, T, T, T) [T = float]");
  }
  fVar15 = tanf(WindowConfig::mainCamera->Zoom * 0.5);
  Result.value[0].field_2 = (anon_union_4_3_4e909dac_for_vec<4,_float,_(glm::qualifier)0>_7)0x0;
  Result.value[0].field_3 = (anon_union_4_3_4e909a07_for_vec<4,_float,_(glm::qualifier)0>_9)0x0;
  Result.value[1].field_2 = (anon_union_4_3_4e909dac_for_vec<4,_float,_(glm::qualifier)0>_7)0x0;
  Result.value[1].field_3 = (anon_union_4_3_4e909a07_for_vec<4,_float,_(glm::qualifier)0>_9)0x0;
  Result.value[2].field_0 = (anon_union_4_3_4e90da17_for_vec<4,_float,_(glm::qualifier)0>_3)0x0;
  Result.value[2].field_1 = (anon_union_4_3_4e90b0ec_for_vec<4,_float,_(glm::qualifier)0>_5)0x0;
  Result.value[3].field_0 = (anon_union_4_3_4e90da17_for_vec<4,_float,_(glm::qualifier)0>_3)0x0;
  Result.value[3].field_1 = (anon_union_4_3_4e90b0ec_for_vec<4,_float,_(glm::qualifier)0>_5)0x0;
  Result.value[0].field_1.y = 0.0;
  Result.value[0].field_0.x = 1.0 / (local_384 * fVar15);
  Result.value[1]._0_8_ = (ulong)(uint)(1.0 / fVar15) << 0x20;
  Result.value[2].field_2 =
       (anon_union_4_3_4e909dac_for_vec<4,_float,_(glm::qualifier)0>_7)0xbf8000a8;
  Result.value[2].field_3 =
       (anon_union_4_3_4e909a07_for_vec<4,_float,_(glm::qualifier)0>_9)0xbf800000;
  Result.value[3].field_2 =
       (anon_union_4_3_4e909dac_for_vec<4,_float,_(glm::qualifier)0>_7)0xbca3d776;
  Result.value[3].field_3 = (anon_union_4_3_4e909a07_for_vec<4,_float,_(glm::qualifier)0>_9)0x0;
  Model::Model(&glTF_model,&glTF_model_path_abi_cxx11_);
  psVar3 = &transparentShader.vertexPath._M_string_length;
  transparentShader._0_8_ = psVar3;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&transparentShader,"../shaders/skin/opaque.vert","");
  psVar1 = &postProcessingShader.vertexPath._M_string_length;
  postProcessingShader._0_8_ = psVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&postProcessingShader,"../shaders/skin/opaque.frag","");
  Shader::Shader(&opaqueShader,(string *)&transparentShader,(string *)&postProcessingShader);
  if ((size_type *)postProcessingShader._0_8_ != psVar1) {
    operator_delete((void *)postProcessingShader._0_8_,
                    postProcessingShader.vertexPath._M_string_length + 1);
  }
  if ((size_type *)transparentShader._0_8_ != psVar3) {
    operator_delete((void *)transparentShader._0_8_,
                    transparentShader.vertexPath._M_string_length + 1);
  }
  Shader::Use(&opaqueShader);
  transparentShader._0_8_ = psVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&transparentShader,"projection","");
  p_Var8 = glad_glUniformMatrix4fv;
  GVar11 = (*glad_glGetUniformLocation)(opaqueShader.Program,(GLchar *)transparentShader._0_8_);
  (*p_Var8)(GVar11,1,'\0',(GLfloat *)&Result);
  if ((size_type *)transparentShader._0_8_ != psVar3) {
    operator_delete((void *)transparentShader._0_8_,
                    transparentShader.vertexPath._M_string_length + 1);
  }
  postProcessingShader._0_8_ = psVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&postProcessingShader,"../shaders/skin/transparent.vert","");
  paVar2 = &local_3c8.field_2;
  local_3c8._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_3c8,"../shaders/skin/transparent.frag","");
  Shader::Shader(&transparentShader,(string *)&postProcessingShader,&local_3c8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3c8._M_dataplus._M_p != paVar2) {
    operator_delete(local_3c8._M_dataplus._M_p,local_3c8.field_2._M_allocated_capacity + 1);
  }
  if ((size_type *)postProcessingShader._0_8_ != psVar1) {
    operator_delete((void *)postProcessingShader._0_8_,
                    postProcessingShader.vertexPath._M_string_length + 1);
  }
  Shader::Use(&transparentShader);
  postProcessingShader._0_8_ = psVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&postProcessingShader,"MAX_NODES","");
  p_Var6 = glad_glUniform1i;
  GVar11 = (*glad_glGetUniformLocation)
                     (transparentShader.Program,(GLchar *)postProcessingShader._0_8_);
  iVar13 = iVar13 * 0x10;
  (*p_Var6)(GVar11,iVar13);
  if ((size_type *)postProcessingShader._0_8_ != psVar1) {
    operator_delete((void *)postProcessingShader._0_8_,
                    postProcessingShader.vertexPath._M_string_length + 1);
  }
  postProcessingShader._0_8_ = psVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&postProcessingShader,"projection","");
  p_Var8 = glad_glUniformMatrix4fv;
  GVar11 = (*glad_glGetUniformLocation)
                     (transparentShader.Program,(GLchar *)postProcessingShader._0_8_);
  (*p_Var8)(GVar11,1,'\0',(GLfloat *)&Result);
  if ((size_type *)postProcessingShader._0_8_ != psVar1) {
    operator_delete((void *)postProcessingShader._0_8_,
                    postProcessingShader.vertexPath._M_string_length + 1);
  }
  local_3c8._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_3c8,"../shaders/skin/postprocessing.vert","");
  _zero = (pointer)&local_2c8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&zero,"../shaders/skin/postprocessing.frag","");
  Shader::Shader(&postProcessingShader,&local_3c8,(string *)&zero);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_zero != &local_2c8) {
    operator_delete(_zero,local_2c8._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3c8._M_dataplus._M_p != paVar2) {
    operator_delete(local_3c8._M_dataplus._M_p,local_3c8.field_2._M_allocated_capacity + 1);
  }
  Shader::Use(&postProcessingShader);
  local_3c8._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3c8,"MAX_NODES","");
  p_Var6 = glad_glUniform1i;
  GVar11 = (*glad_glGetUniformLocation)(postProcessingShader.Program,local_3c8._M_dataplus._M_p);
  (*p_Var6)(GVar11,iVar13);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3c8._M_dataplus._M_p != paVar2) {
    operator_delete(local_3c8._M_dataplus._M_p,local_3c8.field_2._M_allocated_capacity + 1);
  }
  local_3c8._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3c8,"colorTextureMS","");
  p_Var6 = glad_glUniform1i;
  GVar11 = (*glad_glGetUniformLocation)(postProcessingShader.Program,local_3c8._M_dataplus._M_p);
  (*p_Var6)(GVar11,0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3c8._M_dataplus._M_p != paVar2) {
    operator_delete(local_3c8._M_dataplus._M_p,local_3c8.field_2._M_allocated_capacity + 1);
  }
  while (GVar10 = (*glad_glGetError)(), GVar10 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Before Start",0xc);
    lVar9 = std::cout;
    *(uint *)(std::__cxx11::string::find + *(long *)(std::cout + -0x18)) =
         *(uint *)(std::__cxx11::string::find + *(long *)(std::cout + -0x18)) & 0xffffffb5 | 8;
    *(uint *)(std::__cxx11::string::find + *(long *)(lVar9 + -0x18)) =
         *(uint *)(std::__cxx11::string::find + *(long *)(lVar9 + -0x18)) | 0x200;
    poVar12 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar12 + -0x18) + (char)poVar12);
    std::ostream::put((char)poVar12);
    std::ostream::flush();
  }
  while (iVar13 = glfwWindowShouldClose(WindowConfig::window), iVar13 == 0) {
    dVar4 = glfwGetTime();
    local_384 = (float)dVar4;
    RenderLoop::deltaTime = local_384 - RenderLoop::lastFrame;
    RenderLoop::lastFrame = local_384;
    glfwPollEvents();
    Controller::Movement((double)RenderLoop::deltaTime);
    pre_view.value[3].field_0 = view.value[3].field_0;
    pre_view.value[3].field_1 = view.value[3].field_1;
    pre_view.value[3].field_2 = view.value[3].field_2;
    pre_view.value[3].field_3 = view.value[3].field_3;
    pre_view.value[2].field_0 = view.value[2].field_0;
    pre_view.value[2].field_1 = view.value[2].field_1;
    pre_view.value[2].field_2 = view.value[2].field_2;
    pre_view.value[2].field_3 = view.value[2].field_3;
    pre_view.value[1].field_0 = view.value[1].field_0;
    pre_view.value[1].field_1 = view.value[1].field_1;
    pre_view.value[1].field_2 = view.value[1].field_2;
    pre_view.value[1].field_3 = view.value[1].field_3;
    pre_view.value[0].field_0 = view.value[0].field_0;
    pre_view.value[0].field_1 = view.value[0].field_1;
    pre_view.value[0].field_2 = view.value[0].field_2;
    pre_view.value[0].field_3 = view.value[0].field_3;
    Camera::GetViewMatrix((mat4 *)&local_3c8,WindowConfig::mainCamera);
    view.value[3].field_0 = local_398.field_0;
    view.value[3].field_1 = local_398.field_1;
    view.value[3].field_2 = local_398.field_2;
    view.value[3].field_3 = local_398.field_3;
    view.value[2].field_0 = local_3a8.field_0;
    view.value[2].field_1 = local_3a8.field_1;
    view.value[2].field_2 = local_3a8.field_2;
    view.value[2].field_3 = local_3a8.field_3;
    view.value[1].field_0 =
         (anon_union_4_3_4e90da17_for_vec<4,_float,_(glm::qualifier)0>_3)
         local_3c8.field_2._M_allocated_capacity._0_4_;
    view.value[1].field_1 =
         (anon_union_4_3_4e90b0ec_for_vec<4,_float,_(glm::qualifier)0>_5)
         local_3c8.field_2._M_allocated_capacity._4_4_;
    view.value[1].field_2 =
         (anon_union_4_3_4e909dac_for_vec<4,_float,_(glm::qualifier)0>_7)local_3c8.field_2._8_4_;
    view.value[1].field_3 =
         (anon_union_4_3_4e909a07_for_vec<4,_float,_(glm::qualifier)0>_9)local_3c8.field_2._12_4_;
    view.value[0]._0_8_ = local_3c8._M_dataplus._M_p;
    view.value[0].field_2 =
         (anon_union_4_3_4e909dac_for_vec<4,_float,_(glm::qualifier)0>_7)
         (undefined4)local_3c8._M_string_length;
    view.value[0].field_3 =
         (anon_union_4_3_4e909a07_for_vec<4,_float,_(glm::qualifier)0>_9)
         local_3c8._M_string_length._4_4_;
    (*glad_glBindFramebuffer)(0x8d40,multisampledFBO);
    (*glad_glClear)(0x4100);
    Shader::Use(&opaqueShader);
    local_3c8._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_3c8,"view","");
    p_Var8 = glad_glUniformMatrix4fv;
    GVar11 = (*glad_glGetUniformLocation)(opaqueShader.Program,local_3c8._M_dataplus._M_p);
    (*p_Var8)(GVar11,1,'\0',(GLfloat *)&view);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3c8._M_dataplus._M_p != paVar2) {
      operator_delete(local_3c8._M_dataplus._M_p,local_3c8.field_2._M_allocated_capacity + 1);
    }
    local_3c8._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_3c8,"pre_view","");
    p_Var8 = glad_glUniformMatrix4fv;
    GVar11 = (*glad_glGetUniformLocation)(opaqueShader.Program,local_3c8._M_dataplus._M_p);
    (*p_Var8)(GVar11,1,'\0',(GLfloat *)&pre_view);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3c8._M_dataplus._M_p != paVar2) {
      operator_delete(local_3c8._M_dataplus._M_p,local_3c8.field_2._M_allocated_capacity + 1);
    }
    local_3c8._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_3c8,"CameraPos","");
    p_Var7 = glad_glUniform3fv;
    pCVar5 = WindowConfig::mainCamera;
    GVar11 = (*glad_glGetUniformLocation)(opaqueShader.Program,local_3c8._M_dataplus._M_p);
    (*p_Var7)(GVar11,1,(GLfloat *)pCVar5);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3c8._M_dataplus._M_p != paVar2) {
      operator_delete(local_3c8._M_dataplus._M_p,local_3c8.field_2._M_allocated_capacity + 1);
    }
    Model::Update(&glTF_model,(double)local_384);
    Model::Render(&glTF_model,&opaqueShader);
    (*glad_glBindFramebuffer)(0x8d40,0);
    (*glad_glBindTexture)(0xde1,headPtrTex);
    (*glad_glTexSubImage2D)
              (0xde1,0,0,0,WindowConfig::SCR_WIDTH,WindowConfig::SCR_HEIGHT,0x8d94,0x1405,
               headPtrClear.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start);
    _zero = _zero & 0xffffffff00000000;
    (*glad_glBindBuffer)(0x92c0,buffers[0]);
    (*glad_glBufferSubData)(0x92c0,0,4,&zero);
    (*glad_glBindFramebuffer)(0x8ca8,multisampledFBO);
    (*glad_glBindFramebuffer)(0x8ca9,0);
    (*glad_glBlitFramebuffer)
              (0,0,WindowConfig::SCR_WIDTH,WindowConfig::SCR_HEIGHT,0,0,WindowConfig::SCR_WIDTH,
               WindowConfig::SCR_HEIGHT,0x100,0x2600);
    (*glad_glBindFramebuffer)(0x8ca8,0);
    (*glad_glBindFramebuffer)(0x8ca9,0);
    (*glad_glClear)(0x4000);
    (*glad_glDepthMask)('\0');
    Shader::Use(&transparentShader);
    local_3c8._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_3c8,"view","");
    p_Var8 = glad_glUniformMatrix4fv;
    GVar11 = (*glad_glGetUniformLocation)(transparentShader.Program,local_3c8._M_dataplus._M_p);
    (*p_Var8)(GVar11,1,'\0',(GLfloat *)&view);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3c8._M_dataplus._M_p != paVar2) {
      operator_delete(local_3c8._M_dataplus._M_p,local_3c8.field_2._M_allocated_capacity + 1);
    }
    local_3c8._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_3c8,"pre_view","");
    p_Var8 = glad_glUniformMatrix4fv;
    GVar11 = (*glad_glGetUniformLocation)(transparentShader.Program,local_3c8._M_dataplus._M_p);
    (*p_Var8)(GVar11,1,'\0',(GLfloat *)&pre_view);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3c8._M_dataplus._M_p != paVar2) {
      operator_delete(local_3c8._M_dataplus._M_p,local_3c8.field_2._M_allocated_capacity + 1);
    }
    local_3c8._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_3c8,"CameraPos","");
    p_Var7 = glad_glUniform3fv;
    pCVar5 = WindowConfig::mainCamera;
    GVar11 = (*glad_glGetUniformLocation)(transparentShader.Program,local_3c8._M_dataplus._M_p);
    (*p_Var7)(GVar11,1,(GLfloat *)pCVar5);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3c8._M_dataplus._M_p != paVar2) {
      operator_delete(local_3c8._M_dataplus._M_p,local_3c8.field_2._M_allocated_capacity + 1);
    }
    (*glad_glBindBufferBase)(0x92c0,0,buffers[0]);
    (*glad_glBindBufferBase)(0x90d2,0,buffers[1]);
    (*glad_glBindImageTexture)(0,headPtrTex,0,'\0',0,0x88ba,0x8236);
    Model::RenderTransparent(&glTF_model,&transparentShader);
    (*glad_glDepthMask)('\x01');
    (*glad_glClear)(0x100);
    Shader::Use(&postProcessingShader);
    (*glad_glBindBufferBase)(0x90d2,0,buffers[1]);
    (*glad_glBindImageTexture)(0,headPtrTex,0,'\0',0,0x88ba,0x8236);
    (*glad_glActiveTexture)(0x84c0);
    (*glad_glBindTexture)(0x9100,multisampleTex);
    RenderQuad();
    glfwSwapBuffers(WindowConfig::window);
  }
  Model::CleanupModel(&glTF_model);
  (*glad_glDeleteProgram)(opaqueShader.Program);
  (*glad_glDeleteProgram)(postProcessingShader.Program);
  (*glad_glDeleteTextures)(1,&multisampleTex);
  (*glad_glDeleteTextures)(1,&multisampleDepth);
  (*glad_glDeleteFramebuffers)(1,&multisampledFBO);
  (*glad_glDeleteBuffers)(2,buffers);
  (*glad_glDeleteTextures)(1,&headPtrTex);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)postProcessingShader.fragmentPath._M_dataplus._M_p !=
      &postProcessingShader.fragmentPath.field_2) {
    operator_delete(postProcessingShader.fragmentPath._M_dataplus._M_p,
                    postProcessingShader.fragmentPath.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)postProcessingShader.vertexPath._M_dataplus._M_p !=
      &postProcessingShader.vertexPath.field_2) {
    operator_delete(postProcessingShader.vertexPath._M_dataplus._M_p,
                    postProcessingShader.vertexPath.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)transparentShader.fragmentPath._M_dataplus._M_p != &transparentShader.fragmentPath.field_2)
  {
    operator_delete(transparentShader.fragmentPath._M_dataplus._M_p,
                    transparentShader.fragmentPath.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)transparentShader.vertexPath._M_dataplus._M_p != &transparentShader.vertexPath.field_2) {
    operator_delete(transparentShader.vertexPath._M_dataplus._M_p,
                    transparentShader.vertexPath.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)opaqueShader.fragmentPath._M_dataplus._M_p != &opaqueShader.fragmentPath.field_2) {
    operator_delete(opaqueShader.fragmentPath._M_dataplus._M_p,
                    opaqueShader.fragmentPath.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)opaqueShader.vertexPath._M_dataplus._M_p != &opaqueShader.vertexPath.field_2) {
    operator_delete(opaqueShader.vertexPath._M_dataplus._M_p,
                    opaqueShader.vertexPath.field_2._M_allocated_capacity + 1);
  }
  Model::~Model(&glTF_model);
  if (headPtrClear.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(headPtrClear.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)headPtrClear.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)headPtrClear.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void RenderLoop()
{
    GLenum err;
    GLuint multisampledFBO;
    glGenFramebuffers(1, &multisampledFBO);
    glBindFramebuffer(GL_FRAMEBUFFER, multisampledFBO);
    GLuint multisampleTex;
    glGenTextures(1, &multisampleTex);
    glBindTexture(GL_TEXTURE_2D_MULTISAMPLE, multisampleTex);
    glTexImage2DMultisample(GL_TEXTURE_2D_MULTISAMPLE, 4, GL_RGBA32F, WindowConfig::SCR_WIDTH, WindowConfig::SCR_HEIGHT, GL_TRUE);
    glBindTexture(GL_TEXTURE_2D_MULTISAMPLE, 0);
    glFramebufferTexture2D(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_TEXTURE_2D_MULTISAMPLE, multisampleTex, 0);
    GLuint multisampleDepth;
    glGenRenderbuffers(1, &multisampleDepth);
    glBindRenderbuffer(GL_RENDERBUFFER, multisampleDepth);
    glRenderbufferStorageMultisample(GL_RENDERBUFFER, 4, GL_DEPTH24_STENCIL8, WindowConfig::SCR_WIDTH, WindowConfig::SCR_HEIGHT);
    glFramebufferRenderbuffer(GL_FRAMEBUFFER, GL_DEPTH_ATTACHMENT, GL_RENDERBUFFER, multisampleDepth);
    // - Finally check if framebuffer is complete
    if (glCheckFramebufferStatus(GL_FRAMEBUFFER) != GL_FRAMEBUFFER_COMPLETE)
    {
        std::cout << "Framebuffer not complete!" << std::endl;
    }
    glBindFramebuffer(GL_FRAMEBUFFER, 0);
    // OIT buffers
    const int COUNTER_BUFFER = 0;
    const int LINKED_LIST_BUFFER = 1;
    GLuint NUM_NODES = 16 * WindowConfig::SCR_WIDTH * WindowConfig::SCR_HEIGHT;
    GLint SIZE_NODE = 5 * sizeof(GLfloat) + sizeof(GLuint); // The size of a linked list node
    // Our atomic counter
    GLuint buffers[2];
    glGenBuffers(2, buffers);
    glBindBuffer(GL_ATOMIC_COUNTER_BUFFER, buffers[COUNTER_BUFFER]);
    glBufferData(GL_ATOMIC_COUNTER_BUFFER, sizeof(GLuint), NULL, GL_DYNAMIC_DRAW);
    // The buffer of linked lists
    glBindBuffer(GL_SHADER_STORAGE_BUFFER, buffers[LINKED_LIST_BUFFER]);
    glBufferData(GL_SHADER_STORAGE_BUFFER, NUM_NODES * SIZE_NODE, NULL, GL_DYNAMIC_DRAW);

    // The buffer for the head pointers, as an image texture
    GLuint headPtrTex;
    glGenTextures(1, &headPtrTex);
    glBindTexture(GL_TEXTURE_2D, headPtrTex);
    glTexStorage2D(GL_TEXTURE_2D, 1, GL_R32UI, WindowConfig::SCR_WIDTH, WindowConfig::SCR_HEIGHT);

    vector<GLuint> headPtrClear(WindowConfig::SCR_WIDTH * WindowConfig::SCR_HEIGHT, 0xffffffff);
    // GLuint clearBuf;
    // glGenBuffers(1, &clearBuf);
    // glBindBuffer(GL_PIXEL_UNPACK_BUFFER, clearBuf);
    // glBufferData(GL_PIXEL_UNPACK_BUFFER, headPtrClear.size() * sizeof(GLuint), &headPtrClear[0], GL_STREAM_DRAW);

    mat4 view, pre_view;
    mat4 projection = glm::perspective(WindowConfig::mainCamera->Zoom,
                                       (float)WindowConfig::SCR_WIDTH / (float)WindowConfig::SCR_HEIGHT,
                                       NEAR, FAR);
    Model glTF_model(glTF_model_path);
    Shader opaqueShader("../shaders/skin/opaque.vert", "../shaders/skin/opaque.frag");
    opaqueShader.Use();
    opaqueShader.setMat4("projection", projection);

    Shader transparentShader("../shaders/skin/transparent.vert", "../shaders/skin/transparent.frag");
    transparentShader.Use();
    transparentShader.setInt("MAX_NODES", NUM_NODES);
    transparentShader.setMat4("projection", projection);

    Shader postProcessingShader("../shaders/skin/postprocessing.vert", "../shaders/skin/postprocessing.frag");
    postProcessingShader.Use();
    postProcessingShader.setInt("MAX_NODES", NUM_NODES);
    postProcessingShader.setInt("colorTextureMS", 0);

    while ((err = glGetError()) != GL_NO_ERROR)
    {
        cout << "Before Start" << hex << showbase << err << endl;
    }
    static float deltaTime(0.0f); //        float attenuation = 1.0 / (distance * distance);
    static float lastFrame(0.0f);
    while (!glfwWindowShouldClose(WindowConfig::window))
    {
        GLfloat currentFrame = glfwGetTime();
        deltaTime = currentFrame - lastFrame;
        lastFrame = currentFrame;
        // Movement System
        glfwPollEvents();
        Controller::Movement(deltaTime);
        pre_view = view;
        view = WindowConfig::mainCamera->GetViewMatrix();
        // Render model
        glBindFramebuffer(GL_FRAMEBUFFER, multisampledFBO);
        glClear(GL_COLOR_BUFFER_BIT | GL_DEPTH_BUFFER_BIT);
        opaqueShader.Use();
        opaqueShader.setMat4("view", view);
        opaqueShader.setMat4("pre_view", pre_view);
        opaqueShader.setVec3("CameraPos", WindowConfig::mainCamera->Position);
        glTF_model.Update(currentFrame);
        glTF_model.Render(opaqueShader);
        // glTF_model.RenderTransparent(opaqueShader);
        glBindFramebuffer(GL_FRAMEBUFFER, 0);
        // // Clear OIT buffers
        // glBindBuffer(GL_PIXEL_UNPACK_BUFFER, clearBuf);
        glBindTexture(GL_TEXTURE_2D, headPtrTex);
        glTexSubImage2D(GL_TEXTURE_2D, 0, 0, 0, WindowConfig::SCR_WIDTH, WindowConfig::SCR_HEIGHT, GL_RED_INTEGER, GL_UNSIGNED_INT, headPtrClear.data());
        GLuint zero = 0;
        glBindBuffer(GL_ATOMIC_COUNTER_BUFFER, buffers[COUNTER_BUFFER]);
        glBufferSubData(GL_ATOMIC_COUNTER_BUFFER, 0, sizeof(GLuint), &zero);
        // Blit
        glBindFramebuffer(GL_READ_FRAMEBUFFER, multisampledFBO);
        glBindFramebuffer(GL_DRAW_FRAMEBUFFER, 0);
        glBlitFramebuffer(0, 0, WindowConfig::SCR_WIDTH, WindowConfig::SCR_HEIGHT, 
                          0, 0, WindowConfig::SCR_WIDTH,  WindowConfig::SCR_HEIGHT, GL_DEPTH_BUFFER_BIT, GL_NEAREST);
        glBindFramebuffer(GL_READ_FRAMEBUFFER, 0);
        glBindFramebuffer(GL_DRAW_FRAMEBUFFER, 0);
        // Render Transparent
        glClear(GL_COLOR_BUFFER_BIT);
        glDepthMask(GL_FALSE);
        transparentShader.Use();
        transparentShader.setMat4("view", view);
        transparentShader.setMat4("pre_view", pre_view);
        transparentShader.setVec3("CameraPos", WindowConfig::mainCamera->Position);
        glBindBufferBase(GL_ATOMIC_COUNTER_BUFFER, 0, buffers[COUNTER_BUFFER]);
        glBindBufferBase(GL_SHADER_STORAGE_BUFFER, 0, buffers[LINKED_LIST_BUFFER]);
        glBindImageTexture(0, headPtrTex, 0, GL_FALSE, 0, GL_READ_WRITE, GL_R32UI);
        glTF_model.RenderTransparent(transparentShader);
        glDepthMask(GL_TRUE);
        // Render screen
        glClear(GL_DEPTH_BUFFER_BIT);
        postProcessingShader.Use();
        glBindBufferBase(GL_SHADER_STORAGE_BUFFER, 0, buffers[LINKED_LIST_BUFFER]);
        glBindImageTexture(0, headPtrTex, 0, GL_FALSE, 0, GL_READ_WRITE, GL_R32UI);
        glActiveTexture(GL_TEXTURE0);
        glBindTexture(GL_TEXTURE_2D_MULTISAMPLE, multisampleTex);
        RenderQuad();

        // Swap the screen buffers, Check and call events
        glfwSwapBuffers(WindowConfig::window);
    }
    // Release
    glTF_model.CleanupModel();
    opaqueShader.Release();
    postProcessingShader.Release();
    glDeleteTextures(1, &multisampleTex);
    glDeleteTextures(1, &multisampleDepth);
    glDeleteFramebuffers(1, &multisampledFBO);
    glDeleteBuffers(2, buffers);
    glDeleteTextures(1, &headPtrTex);
}